

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_bitset_container_andnot
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  uint64_t *puVar5;
  int iVar6;
  array_container_t *paVar7;
  bitset_container_t *bitset;
  byte bVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int run_value;
  int iVar13;
  uint uVar14;
  uint uVar15;
  
  lVar9 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar9 + 4) & 0x20) == 0) {
    iVar6 = src_1->n_runs;
    lVar9 = (long)iVar6;
    if (0 < lVar9) {
      lVar11 = 0;
      do {
        iVar6 = iVar6 + (uint)src_1->runs[lVar11].length;
        lVar11 = lVar11 + 1;
      } while (lVar9 != lVar11);
    }
  }
  else {
    iVar6 = _avx2_run_container_cardinality(src_1);
  }
  if (iVar6 < 0x1001) {
    paVar7 = array_container_create_given_capacity(iVar6);
    paVar7->cardinality = 0;
    iVar6 = src_1->n_runs;
    if (0 < (long)iVar6) {
      prVar4 = src_1->runs;
      puVar5 = src_2->words;
      lVar9 = 0;
      do {
        uVar12 = (ulong)prVar4[lVar9].value;
        iVar13 = prVar4[lVar9].length + 1;
        do {
          if ((*(ulong *)((long)puVar5 + (ulong)((uint)(uVar12 >> 3) & 0x1ff8)) >> (uVar12 & 0x3f) &
              1) == 0) {
            iVar3 = paVar7->cardinality;
            paVar7->cardinality = iVar3 + 1;
            paVar7->array[iVar3] = (uint16_t)uVar12;
          }
          uVar12 = (ulong)((int)uVar12 + 1);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar6);
    }
    *dst = paVar7;
  }
  else {
    bitset = bitset_container_clone(src_2);
    iVar6 = src_1->n_runs;
    if ((long)iVar6 < 1) {
      uVar14 = 0;
    }
    else {
      prVar4 = src_1->runs;
      puVar5 = bitset->words;
      lVar9 = 0;
      uVar14 = 0;
      do {
        uVar1 = prVar4[lVar9].value;
        uVar2 = prVar4[lVar9].length;
        bVar8 = (byte)uVar1;
        if (uVar14 != uVar1) {
          uVar10 = uVar14 >> 6;
          uVar12 = -1L << ((byte)uVar14 & 0x3f);
          uVar14 = uVar1 - 1 >> 6;
          if (uVar14 - uVar10 == 0) {
            uVar12 = (uVar12 << (-bVar8 & 0x3f)) >> (-bVar8 & 0x3f);
            uVar14 = uVar10;
          }
          else {
            puVar5[uVar10] = puVar5[uVar10] & ~uVar12;
            if (uVar10 + 1 < uVar14) {
              memset(puVar5 + (ulong)uVar10 + 1,0,(ulong)((uVar14 - uVar10) - 2) * 8 + 8);
            }
            uVar12 = 0xffffffffffffffff >> (-bVar8 & 0x3f);
          }
          puVar5[uVar14] = puVar5[uVar14] & ~uVar12;
        }
        uVar14 = (uint)uVar2 + (uint)uVar1 + 1;
        if (uVar14 != uVar1) {
          uVar15 = (uint)uVar2 + (uint)uVar1;
          uVar12 = (ulong)(uint)(uVar1 >> 6);
          uVar10 = uVar15 >> 6;
          puVar5[uVar12] = ~(-1L << (bVar8 & 0x3f) ^ puVar5[uVar12]);
          if (uVar1 >> 6 < uVar10) {
            do {
              puVar5[uVar12] = ~puVar5[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
          }
          puVar5[uVar10] = puVar5[uVar10] ^ 0xffffffffffffffffU >> (~(byte)uVar15 & 0x3f);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar6);
    }
    if (uVar14 != 0x10000) {
      puVar5 = bitset->words;
      uVar10 = uVar14 >> 6;
      puVar5[uVar10] = puVar5[uVar10] & ~(-1L << ((byte)uVar14 & 0x3f));
      if (uVar10 != 0x3ff) {
        if (uVar14 < 0xff80) {
          memset((void *)((long)puVar5 + (ulong)(uVar14 >> 3 & 0x1ff8) + 8),0,
                 (ulong)(0x3fd - uVar10) * 8 + 8);
        }
        puVar5[0x3ff] = 0;
      }
    }
    iVar6 = bitset_container_compute_cardinality(bitset);
    bitset->cardinality = iVar6;
    if (0x1000 < iVar6) {
      *dst = bitset;
      return true;
    }
    paVar7 = array_container_from_bitset(bitset);
    *dst = paVar7;
    bitset_container_free(bitset);
  }
  return false;
}

Assistant:

bool run_bitset_container_andnot(
    const run_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    // follows the Java implementation as of June 2016
    int card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // must be an array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            for (int run_value = rle.value; run_value <= rle.value + rle.length;
                 ++run_value) {
                if (!bitset_container_get(src_2, (uint16_t)run_value)) {
                    answer->array[answer->cardinality++] = (uint16_t)run_value;
                }
            }
        }
        *dst = answer;
        return false;
    } else {  // we guess it will be a bitset, though have to check guess when
              // done
        bitset_container_t *answer = bitset_container_clone(src_2);

        uint32_t last_pos = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];

            uint32_t start = rle.value;
            uint32_t end = start + rle.length + 1;
            bitset_reset_range(answer->words, last_pos, start);
            bitset_flip_range(answer->words, start, end);
            last_pos = end;
        }
        bitset_reset_range(answer->words, last_pos, (uint32_t)(1 << 16));

        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality <= DEFAULT_MAX_SIZE) {
            *dst = array_container_from_bitset(answer);
            bitset_container_free(answer);
            return false;  // not bitset
        }
        *dst = answer;
        return true;  // bitset
    }
}